

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Inputs.cpp
# Opt level: O0

double helics::doubleExtractAndConvert
                 (data_view *dv,shared_ptr<units::precise_unit> *inputUnits,
                 shared_ptr<units::precise_unit> *outputUnits)

{
  bool bVar1;
  __shared_ptr *in_RDX;
  __shared_ptr *in_RSI;
  double V;
  precise_unit *in_stack_000000b8;
  precise_unit *in_stack_000000c0;
  double in_stack_000000c8;
  data_view *in_stack_ffffffffffffffd0;
  __shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *local_20;
  
  local_20 = (__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *)
             ValueConverter<double>::interpret(in_stack_ffffffffffffffd0);
  bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RSI);
  if ((bVar1) && (bVar1 = std::__shared_ptr::operator_cast_to_bool(in_RDX), bVar1)) {
    std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*(local_20);
    std::__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false>::
    operator*(local_20);
    local_20 = (__shared_ptr_access<units::precise_unit,_(__gnu_cxx::_Lock_policy)2,_false,_false> *
               )::units::convert<units::precise_unit,units::precise_unit>
                          (in_stack_000000c8,in_stack_000000c0,in_stack_000000b8);
  }
  return (double)local_20;
}

Assistant:

double doubleExtractAndConvert(const data_view& dv,
                               const std::shared_ptr<units::precise_unit>& inputUnits,
                               const std::shared_ptr<units::precise_unit>& outputUnits)
{
    auto V = ValueConverter<double>::interpret(dv);
    if ((inputUnits) && (outputUnits)) {
        V = units::convert(V, *inputUnits, *outputUnits);
    }
    return V;
}